

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall QMdiSubWindow::setSystemMenu(QMdiSubWindow *this,QMenu *systemMenu)

{
  QWeakPointer<QObject> *this_00;
  long lVar1;
  bool bVar2;
  QMenu *pQVar3;
  long in_FS_OFFSET;
  char local_48 [24];
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  if (systemMenu == (QMenu *)0x0) {
LAB_0041a5fd:
    this_00 = (QWeakPointer<QObject> *)(lVar1 + 0x308);
    bVar2 = QPointer::operator_cast_to_bool((QPointer *)this_00);
    if (bVar2) {
      if (((this_00->d != (Data *)0x0) && (*(int *)(this_00->d + 4) != 0)) &&
         (*(long **)(lVar1 + 0x310) != (long *)0x0)) {
        (**(code **)(**(long **)(lVar1 + 0x310) + 0x20))();
      }
      QWeakPointer<QObject>::assign<QObject>(this_00,(QObject *)0x0);
    }
    if (systemMenu != (QMenu *)0x0) {
      if (*(QMdiSubWindow **)(*(long *)&(systemMenu->super_QWidget).field_0x8 + 0x10) != this) {
        QWidget::setParent(&systemMenu->super_QWidget,&this->super_QWidget);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        QWeakPointer<QObject>::assign<QObject>(this_00,(QObject *)systemMenu);
        return;
      }
      goto LAB_0041a6c6;
    }
  }
  else {
    if ((*(long *)(lVar1 + 0x308) == 0) || (*(int *)(*(long *)(lVar1 + 0x308) + 4) == 0)) {
      pQVar3 = (QMenu *)0x0;
    }
    else {
      pQVar3 = *(QMenu **)(lVar1 + 0x310);
    }
    if (pQVar3 != systemMenu) goto LAB_0041a5fd;
    local_48[0] = '\x02';
    local_48[1] = '\0';
    local_48[2] = '\0';
    local_48[3] = '\0';
    local_48[0x14] = '\0';
    local_48[0x15] = '\0';
    local_48[0x16] = '\0';
    local_48[0x17] = '\0';
    local_48[4] = '\0';
    local_48[5] = '\0';
    local_48[6] = '\0';
    local_48[7] = '\0';
    local_48[8] = '\0';
    local_48[9] = '\0';
    local_48[10] = '\0';
    local_48[0xb] = '\0';
    local_48[0xc] = '\0';
    local_48[0xd] = '\0';
    local_48[0xe] = '\0';
    local_48[0xf] = '\0';
    local_48[0x10] = '\0';
    local_48[0x11] = '\0';
    local_48[0x12] = '\0';
    local_48[0x13] = '\0';
    local_30 = "default";
    QMessageLogger::warning(local_48,"QMdiSubWindow::setSystemMenu: system menu is already set");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_0041a6c6:
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindow::setSystemMenu(QMenu *systemMenu)
{
    Q_D(QMdiSubWindow);
    if (Q_UNLIKELY(systemMenu && systemMenu == d->systemMenu)) {
        qWarning("QMdiSubWindow::setSystemMenu: system menu is already set");
        return;
    }

    if (d->systemMenu) {
        delete d->systemMenu;
        d->systemMenu = nullptr;
    }

    if (!systemMenu)
        return;

    if (systemMenu->parent() != this)
        systemMenu->setParent(this);
    d->systemMenu = systemMenu;
}